

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simulation.cpp
# Opt level: O2

void TestSimulations(PlanningUnitDecPOMDPDiscrete *pu,shared_ptr<JointPolicyDiscrete> *jp,
                    size_t nrRuns)

{
  ostream *poVar1;
  double dVar2;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  string local_e8 [32];
  double local_c8 [6];
  shared_ptr local_98 [48];
  SimulationDecPOMDPDiscrete local_68 [80];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Starting simulation of ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," runs");
  std::endl<char,std::char_traits<char>>(poVar1);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete(local_68,pu,(int)nrRuns,0x7fffffff,false);
  SimulationResult::SimulationResult((SimulationResult *)local_c8);
  SimulationDecPOMDPDiscrete::RunSimulations(local_98);
  SimulationResult::operator=((SimulationResult *)local_c8,(SimulationResult *)local_98);
  SimulationResult::~SimulationResult((SimulationResult *)local_98);
  std::operator<<((ostream *)&std::cout,"Averaged reward: ");
  poVar1 = std::ostream::_M_insert<double>(local_c8[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  dVar2 = (double)(**(code **)(*(long *)pu + 0x98))(pu);
  std::operator<<((ostream *)&std::cout,"Expected reward: ");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"/tmp/tst_sim_results",(allocator<char> *)local_98);
  SimulationResult::Save(local_c8,local_e8);
  std::__cxx11::string::~string(local_e8);
  SimulationResult::~SimulationResult((SimulationResult *)local_c8);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_68);
  return;
}

Assistant:

void TestSimulations(PlanningUnitDecPOMDPDiscrete* pu,
                     boost::shared_ptr<JointPolicyDiscrete> jp, size_t nrRuns)
{
//    int nrRuns=10000;
    cout << "Starting simulation of "<<nrRuns<<" runs"<<endl;  

    SimulationDecPOMDPDiscrete sim(*pu,nrRuns);

    SimulationResult result;
    result=sim.RunSimulations(jp);

    cout << "Averaged reward: " << result.GetAvgReward() << endl;
    double er = 0.0;
    try{
        er = pu->GetExpectedReward();
        cout << "Expected reward: " << er  << endl;
    } catch(E& e) {
        //NullPlanner throws exception
        cout << "Expected reward was not defined by planning unit" << endl;
    }


    result.Save("/tmp/tst_sim_results");
}